

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builtins.c
# Opt level: O0

int do_mknod(int nargs,char **args)

{
  char cVar1;
  mode_t mVar2;
  int iVar3;
  uint uVar4;
  __mode_t __mask;
  int *piVar5;
  long in_RSI;
  dev_t dev;
  mode_t mask;
  mode_t perm;
  mode_t mode;
  __dev_t local_28;
  uint local_14;
  int local_4;
  
  mVar2 = get_mode(*(char **)(in_RSI + 8));
  cVar1 = **(char **)(in_RSI + 0x18);
  if (cVar1 == 'b') {
    local_14 = 0x6000;
  }
  else {
    if ((cVar1 != 'c') && (cVar1 != 'u')) {
      return -1;
    }
    local_14 = 0x2000;
  }
  if ((local_14 == 0x2000) || (local_14 == 0x6000)) {
    iVar3 = atoi(*(char **)(in_RSI + 0x20));
    uVar4 = atoi(*(char **)(in_RSI + 0x28));
    local_28 = (__dev_t)(int)(iVar3 << 8 | uVar4);
  }
  __mask = umask(0);
  iVar3 = mknod(*(char **)(in_RSI + 0x10),mVar2 | local_14,local_28);
  if (iVar3 == 0) {
    umask(__mask);
    local_4 = 0;
  }
  else {
    piVar5 = __errno_location();
    local_4 = -*piVar5;
  }
  return local_4;
}

Assistant:

int do_mknod(int nargs, char **args) {
    mode_t mode, perm, mask;
    dev_t dev;

    perm = get_mode(args[1]);
    switch (args[3][0]) {
        case 'c':
        case 'u':
            mode = S_IFCHR;
            break;
        case 'b':
            mode = S_IFBLK;
            break;
        default:
            return -1;
    }

    if (mode == S_IFCHR || mode == S_IFBLK)
        dev = (atoi(args[4]) << 8) | atoi(args[5]);

    mode |= perm;
    mask = umask(0);
    if (mknod(args[2], mode, dev) != 0)
        return -errno;
    umask(mask);

    return 0;
}